

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_conf_max_frag_len(mbedtls_ssl_config *conf,uchar mfl_code)

{
  uchar mfl_code_local;
  mbedtls_ssl_config *conf_local;
  
  if ((mfl_code < 5) && (mfl_code_to_length[mfl_code] < 0x4001)) {
    *(uint *)&conf->field_0x174 = *(uint *)&conf->field_0x174 & 0xfffffc7f | (mfl_code & 7) << 7;
    conf_local._4_4_ = 0;
  }
  else {
    conf_local._4_4_ = -0x7100;
  }
  return conf_local._4_4_;
}

Assistant:

int mbedtls_ssl_conf_max_frag_len( mbedtls_ssl_config *conf, unsigned char mfl_code )
{
    if( mfl_code >= MBEDTLS_SSL_MAX_FRAG_LEN_INVALID ||
        mfl_code_to_length[mfl_code] > MBEDTLS_SSL_MAX_CONTENT_LEN )
    {
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    conf->mfl_code = mfl_code;

    return( 0 );
}